

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallGenerator.cxx
# Opt level: O0

void __thiscall
cmInstallGenerator::cmInstallGenerator
          (cmInstallGenerator *this,char *destination,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *configurations,char *component,MessageLevel message)

{
  char *local_a8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_88;
  allocator local_66;
  allocator local_65 [20];
  allocator local_51;
  string local_50;
  MessageLevel local_2c;
  char *pcStack_28;
  MessageLevel message_local;
  char *component_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *configurations_local;
  char *destination_local;
  cmInstallGenerator *this_local;
  
  local_2c = message;
  pcStack_28 = component;
  component_local = (char *)configurations;
  configurations_local =
       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        *)destination;
  destination_local = (char *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_50,"CMAKE_INSTALL_CONFIG_NAME",&local_51);
  cmScriptGenerator::cmScriptGenerator
            (&this->super_cmScriptGenerator,&local_50,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)component_local);
  std::__cxx11::string::~string((string *)&local_50);
  std::allocator<char>::~allocator((allocator<char> *)&local_51);
  (this->super_cmScriptGenerator)._vptr_cmScriptGenerator =
       (_func_int **)&PTR__cmInstallGenerator_00a7e578;
  if (configurations_local ==
      (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       *)0x0) {
    local_88 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)0x93e5db;
  }
  else {
    local_88 = configurations_local;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&this->Destination,(char *)local_88,local_65);
  std::allocator<char>::~allocator((allocator<char> *)local_65);
  if (pcStack_28 == (char *)0x0) {
    local_a8 = "";
  }
  else {
    local_a8 = pcStack_28;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&this->Component,local_a8,&local_66);
  std::allocator<char>::~allocator((allocator<char> *)&local_66);
  this->Message = local_2c;
  return;
}

Assistant:

cmInstallGenerator
::cmInstallGenerator(const char* destination,
                     std::vector<std::string> const& configurations,
                     const char* component,
                     MessageLevel message):
  cmScriptGenerator("CMAKE_INSTALL_CONFIG_NAME", configurations),
  Destination(destination? destination:""),
  Component(component? component:""),
  Message(message)
{
}